

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invert.c
# Opt level: O3

OPJ_BOOL opj_matrix_inversion_f
                   (OPJ_FLOAT32 *pSrcMatrix,OPJ_FLOAT32 *pDestMatrix,OPJ_UINT32 nb_compo)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint *__s;
  void *__dest;
  OPJ_FLOAT32 *pOVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  ulong __n;
  ulong uVar12;
  OPJ_FLOAT32 *pOVar13;
  uint *puVar14;
  float *pfVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  OPJ_UINT32 OVar20;
  OPJ_BOOL OVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  uint local_a0;
  long local_90;
  uint *local_58;
  
  __s = (uint *)opj_malloc((ulong)(nb_compo << 4));
  if (__s == (uint *)0x0) {
    return 0;
  }
  __n = (ulong)(nb_compo * 4);
  __dest = (void *)((long)__s + __n);
  uVar24 = 0;
  memset(__s,0,__n);
  auVar4 = _DAT_0013c030;
  auVar3 = _DAT_0013c020;
  auVar2 = _DAT_0013c010;
  uVar23 = (ulong)nb_compo;
  uVar6 = nb_compo - 1;
  if (nb_compo != 0) {
    lVar17 = uVar23 - 1;
    auVar26._8_4_ = (int)lVar17;
    auVar26._0_8_ = lVar17;
    auVar26._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar12 = 0;
    auVar26 = auVar26 ^ _DAT_0013c030;
    do {
      uVar10 = (uint)uVar12;
      auVar27._8_4_ = uVar10;
      auVar27._0_8_ = uVar12;
      auVar27._12_4_ = (int)(uVar12 >> 0x20);
      auVar28 = (auVar27 | auVar3) ^ auVar4;
      iVar7 = auVar26._4_4_;
      if ((bool)(~(auVar28._4_4_ == iVar7 && auVar26._0_4_ < auVar28._0_4_ || iVar7 < auVar28._4_4_)
                & 1)) {
        __s[uVar12] = uVar10;
      }
      if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
          auVar28._12_4_ <= auVar26._12_4_) {
        __s[uVar12 + 1] = uVar10 + 1;
      }
      auVar27 = (auVar27 | auVar2) ^ auVar4;
      iVar29 = auVar27._4_4_;
      if (iVar29 <= iVar7 && (iVar29 != iVar7 || auVar27._0_4_ <= auVar26._0_4_)) {
        __s[uVar12 + 2] = uVar10 + 2;
        __s[uVar12 + 3] = uVar10 + 3;
      }
      uVar12 = uVar12 + 4;
    } while ((uVar23 + 3 & 0xfffffffffffffffc) != uVar12);
    if (uVar6 == 0) {
      uVar23 = 1;
      goto LAB_0010e376;
    }
  }
  local_a0 = 1;
  local_90 = 0;
  uVar18 = 0;
  pOVar8 = pSrcMatrix;
  pOVar13 = pSrcMatrix;
  uVar12 = (ulong)uVar6;
  local_58 = __s;
  do {
    OVar21 = 0;
    if (uVar18 == uVar23) goto LAB_0010e4f3;
    pfVar16 = (float *)(pOVar8 + uVar18);
    uVar11 = uVar18 & 0xffffffff;
    pfVar9 = (float *)pOVar13;
    fVar25 = 0.0;
    do {
      fVar1 = *pfVar9;
      if (fVar1 <= -fVar1) {
        fVar1 = -fVar1;
      }
      uVar5 = uVar11;
      if (fVar1 <= fVar25) {
        fVar1 = fVar25;
        uVar5 = uVar24;
      }
      uVar24 = uVar5;
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
      pfVar9 = pfVar9 + uVar23;
      fVar25 = fVar1;
    } while (nb_compo != uVar10);
    if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_0010e4f3;
    if (uVar18 != uVar24) {
      uVar10 = *local_58;
      *local_58 = local_58[uVar24 - uVar18];
      local_58[uVar24 - uVar18] = uVar10;
      memcpy(__dest,pOVar8 + ((int)uVar24 - (int)uVar18) * nb_compo,__n);
      memcpy(pOVar8 + ((int)uVar24 - (int)uVar18) * nb_compo,pOVar8,__n);
      memcpy(pOVar8,__dest,__n);
    }
    if (local_a0 < nb_compo) {
      fVar25 = *pfVar16;
      pfVar9 = pfVar16 + uVar23;
      pfVar16 = pfVar16 + 1;
      uVar10 = local_a0;
      do {
        fVar1 = *pfVar9;
        *pfVar9 = fVar1 / fVar25;
        pfVar9 = pfVar9 + 1;
        lVar22 = 0;
        lVar17 = (uVar12 & 0xffffffff) << 2;
        do {
          *pfVar9 = pfVar16[lVar22] * -(fVar1 / fVar25) + *pfVar9;
          pfVar9 = pfVar9 + 1;
          lVar22 = lVar22 + 1;
          lVar17 = lVar17 + -4;
        } while ((int)uVar12 != (int)lVar22);
        pfVar16 = (float *)((long)pfVar16 - lVar17);
        pfVar9 = (float *)((long)pfVar9 - local_90);
        uVar10 = uVar10 + 1;
      } while (uVar10 != nb_compo);
    }
    local_a0 = local_a0 + 1;
    uVar12 = uVar12 - 1;
    pOVar8 = pOVar8 + uVar23;
    local_58 = local_58 + 1;
    uVar18 = uVar18 + 1;
    pOVar13 = (OPJ_FLOAT32 *)((float *)pOVar13 + uVar23 + 1);
    local_90 = local_90 + -4;
  } while (uVar18 != uVar6);
LAB_0010e376:
  pfVar16 = (float *)((long)__dest + (ulong)(nb_compo * 2) * 4);
  uVar24 = 0;
  do {
    memset(__dest,0,__n);
    *(undefined4 *)((long)__dest + uVar24 * 4) = 0x3f800000;
    OVar20 = 0;
    pOVar8 = pSrcMatrix;
    puVar14 = __s;
    pfVar9 = pfVar16;
    do {
      fVar25 = 0.0;
      if (OVar20 != 0) {
        lVar17 = 0;
        do {
          fVar25 = fVar25 + (float)pOVar8[lVar17] * pfVar16[lVar17];
          lVar17 = lVar17 + 1;
        } while (OVar20 != (OPJ_UINT32)lVar17);
      }
      uVar6 = *puVar14;
      puVar14 = puVar14 + 1;
      *pfVar9 = *(float *)((long)__dest + (ulong)uVar6 * 4) - fVar25;
      pfVar9 = pfVar9 + 1;
      OVar20 = OVar20 + 1;
      pOVar8 = pOVar8 + uVar23;
    } while (OVar20 != nb_compo);
    iVar7 = 0;
    pOVar8 = pSrcMatrix + nb_compo * nb_compo;
    pfVar15 = pfVar16 + uVar23;
    pfVar19 = (float *)((long)__dest + uVar23 * 8);
    pfVar9 = (float *)(pSrcMatrix + ((ulong)(nb_compo * nb_compo) - 1));
    OVar20 = nb_compo;
    do {
      fVar25 = 0.0;
      if (OVar20 < nb_compo) {
        lVar17 = 0;
        do {
          fVar25 = fVar25 + (float)pOVar8[lVar17] * pfVar19[lVar17];
          lVar17 = lVar17 + 1;
        } while (iVar7 != (int)lVar17);
      }
      pfVar19 = pfVar19 + -1;
      pfVar15 = pfVar15 + -1;
      OVar20 = OVar20 - 1;
      *pfVar19 = (*pfVar15 - fVar25) / *pfVar9;
      pfVar9 = pfVar9 + -(ulong)(nb_compo + 1);
      pOVar8 = pOVar8 + -(ulong)(nb_compo + 1);
      iVar7 = iVar7 + 1;
    } while (OVar20 != 0);
    uVar12 = 0;
    pOVar8 = pDestMatrix;
    do {
      *pOVar8 = *(OPJ_FLOAT32 *)((long)__dest + uVar12 * 4 + uVar23 * 4);
      uVar12 = uVar12 + 1;
      pOVar8 = pOVar8 + uVar23;
    } while (uVar23 != uVar12);
    pDestMatrix = pDestMatrix + 1;
    uVar24 = uVar24 + 1;
  } while (uVar24 != uVar23);
  OVar21 = 1;
LAB_0010e4f3:
  opj_free(__s);
  return OVar21;
}

Assistant:

OPJ_BOOL opj_matrix_inversion_f(OPJ_FLOAT32 * pSrcMatrix,
                                OPJ_FLOAT32 * pDestMatrix,
                                OPJ_UINT32 nb_compo)
{
    OPJ_BYTE * l_data = 00;
    OPJ_UINT32 l_permutation_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_UINT32);
    OPJ_UINT32 l_swap_size = nb_compo * (OPJ_UINT32)sizeof(OPJ_FLOAT32);
    OPJ_UINT32 l_total_size = l_permutation_size + 3 * l_swap_size;
    OPJ_UINT32 * lPermutations = 00;
    OPJ_FLOAT32 * l_double_data = 00;

    l_data = (OPJ_BYTE *) opj_malloc(l_total_size);
    if (l_data == 0) {
        return OPJ_FALSE;
    }
    lPermutations = (OPJ_UINT32 *) l_data;
    l_double_data = (OPJ_FLOAT32 *)(l_data + l_permutation_size);
    memset(lPermutations, 0, l_permutation_size);

    if (! opj_lupDecompose(pSrcMatrix, lPermutations, l_double_data, nb_compo)) {
        opj_free(l_data);
        return OPJ_FALSE;
    }

    opj_lupInvert(pSrcMatrix, pDestMatrix, nb_compo, lPermutations, l_double_data,
                  l_double_data + nb_compo, l_double_data + 2 * nb_compo);
    opj_free(l_data);

    return OPJ_TRUE;
}